

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall QtPromisePrivate::PromiseResolver<void>::resolve(PromiseResolver<void> *this)

{
  QPromise<void> *pQVar1;
  Data *pDVar2;
  PromiseData<void> *this_00;
  PromiseDataBase<void,_void_()> *this_01;
  QPromise<void> *promise;
  PromiseResolver<void> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::operator->
                     (&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<void> *)0x0) {
    this_00 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>::operator->
                        (&(pQVar1->super_QPromiseBase<void>).m_d);
    PromiseData<void>::resolve(this_00);
    this_01 = &QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>::operator->
                         (&(pQVar1->super_QPromiseBase<void>).m_d)->
               super_PromiseDataBase<void,_void_()>;
    PromiseDataBase<void,_void_()>::dispatch(this_01);
    release(this);
  }
  return;
}

Assistant:

void resolve()
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->resolve();
            promise->m_d->dispatch();
            release();
        }
    }